

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMXPathExpressionImpl.cpp
# Opt level: O3

DOMXPathResult * __thiscall
xercesc_4_0::DOMXPathExpressionImpl::evaluate
          (DOMXPathExpressionImpl *this,DOMNode *contextNode,ResultType type,DOMXPathResult *result)

{
  DOMXPathResultImpl *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *rawName;
  undefined4 extraout_var_00;
  DOMElement *node;
  undefined4 extraout_var_01;
  DOMException *pDVar3;
  code *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  long *plVar6;
  JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> r_cleanup;
  XPathMatcher matcher;
  QName qName;
  SchemaElementDecl elemDecl;
  JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl> local_180;
  RefVectorOf<xercesc_4_0::XMLAttr> local_168;
  XPathMatcher local_138;
  QName local_f0;
  SchemaElementDecl local_a8;
  
  if (type + ~FIRST_ORDERED_NODE_TYPE < 0xfffffffc) {
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMXPathException::DOMXPathException((DOMXPathException *)pDVar3,0x34,0,this->fMemoryManager);
    ppuVar5 = &DOMXPathException::typeinfo;
    pcVar4 = DOMXPathException::~DOMXPathException;
  }
  else {
    if ((contextNode != (DOMNode *)0x0) &&
       (iVar2 = (*contextNode->_vptr_DOMNode[4])(contextNode), iVar2 == 1)) {
      local_180.fObject = (DOMXPathResultImpl *)0x0;
      local_180.fToCall = 0x71;
      local_180._16_8_ = 0;
      if (result == (DOMXPathResult *)0x0) {
        result = (DOMXPathResult *)XMemory::operator_new(0x28,this->fMemoryManager);
        DOMXPathResultImpl::DOMXPathResultImpl
                  ((DOMXPathResultImpl *)result,type,this->fMemoryManager);
        pDVar1 = (DOMXPathResultImpl *)result;
        if ((local_180.fObject != (DOMXPathResultImpl *)0x0) &&
           (pDVar1 = (DOMXPathResultImpl *)result, (code *)local_180.fToCall != (code *)0x0)) {
          pcVar4 = (code *)local_180.fToCall;
          if ((local_180.fToCall & 1) != 0) {
            pcVar4 = *(code **)(local_180.fToCall +
                               *(long *)((long)&((local_180.fObject)->super_DOMXPathResult).
                                                _vptr_DOMXPathResult + local_180._16_8_) + -1);
          }
          (*pcVar4)();
          pDVar1 = (DOMXPathResultImpl *)result;
        }
      }
      else {
        DOMXPathResultImpl::reset((DOMXPathResultImpl *)result,type);
        pDVar1 = local_180.fObject;
      }
      local_180.fObject = pDVar1;
      XPathMatcher::XPathMatcher(&local_138,this->fParsedExpression,this->fMemoryManager);
      XPathMatcher::startDocumentFragment(&local_138);
      if (this->fMoveToRoot == true) {
        iVar2 = (*contextNode->_vptr_DOMNode[0xc])(contextNode);
        if (CONCAT44(extraout_var,iVar2) == 0) {
          pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(pDVar3,9,0,this->fMemoryManager);
          __cxa_throw(pDVar3,&DOMException::typeinfo,DOMException::~DOMException);
        }
        plVar6 = (long *)(CONCAT44(extraout_var,iVar2) + 0x18);
        rawName = (XMLCh *)(**(code **)(*plVar6 + 0x10))(plVar6);
        QName::QName(&local_f0,rawName,0,this->fMemoryManager);
        SchemaElementDecl::SchemaElementDecl
                  (&local_a8,&local_f0,Any,0xfffffffe,XMLPlatformUtils::fgMemoryManager);
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager = this->fMemoryManager;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fAdoptedElems = true;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fCurCount = 0;
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMaxCount = 0;
        iVar2 = (*(local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager)->
                  _vptr_MemoryManager[3])
                          (local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fMemoryManager,0);
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>.fElemList =
             (XMLAttr **)CONCAT44(extraout_var_00,iVar2);
        local_168.super_BaseRefVectorOf<xercesc_4_0::XMLAttr>._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__RefVectorOf_00406678;
        XPathMatcher::startElement
                  (&local_138,&local_a8.super_XMLElementDecl,0,L"",&local_168,0,
                   (ValidationContext *)0x0);
        node = (DOMElement *)(**(code **)(*plVar6 + 0x38))(plVar6);
        while (node != (DOMElement *)0x0) {
          iVar2 = (*(node->super_DOMNode)._vptr_DOMNode[4])(node);
          if (iVar2 == 1) {
            testNode(this,&local_138,(DOMXPathResultImpl *)result,node);
          }
          iVar2 = (*(node->super_DOMNode)._vptr_DOMNode[10])(node);
          node = (DOMElement *)CONCAT44(extraout_var_01,iVar2);
        }
        XPathMatcher::endElement
                  (&local_138,&local_a8.super_XMLElementDecl,L"",(ValidationContext *)0x0,
                   (DatatypeValidator *)0x0);
        RefVectorOf<xercesc_4_0::XMLAttr>::~RefVectorOf(&local_168);
        SchemaElementDecl::~SchemaElementDecl(&local_a8);
        QName::~QName(&local_f0);
      }
      else {
        testNode(this,&local_138,(DOMXPathResultImpl *)result,(DOMElement *)contextNode);
      }
      local_180.fObject = (DOMXPathResultImpl *)0x0;
      XPathMatcher::~XPathMatcher(&local_138);
      JanitorMemFunCall<xercesc_4_0::DOMXPathResultImpl>::~JanitorMemFunCall(&local_180);
      return &((DOMXPathResultImpl *)result)->super_DOMXPathResult;
    }
    pDVar3 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(pDVar3,9,0,this->fMemoryManager);
    ppuVar5 = &DOMException::typeinfo;
    pcVar4 = DOMException::~DOMException;
  }
  __cxa_throw(pDVar3,ppuVar5,pcVar4);
}

Assistant:

DOMXPathResult* DOMXPathExpressionImpl::evaluate(const DOMNode *contextNode,
                                                 DOMXPathResult::ResultType type,
                                                 DOMXPathResult* result) const
{
    if(type!=DOMXPathResult::FIRST_ORDERED_NODE_TYPE && type!=DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE &&
       type!=DOMXPathResult::ANY_UNORDERED_NODE_TYPE && type!=DOMXPathResult::UNORDERED_NODE_SNAPSHOT_TYPE)
        throw DOMXPathException(DOMXPathException::TYPE_ERR, 0, fMemoryManager);

    if(contextNode==NULL || contextNode->getNodeType()!=DOMNode::ELEMENT_NODE)
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    JanitorMemFunCall<DOMXPathResultImpl> r_cleanup (
      0, &DOMXPathResultImpl::release);
    DOMXPathResultImpl* r=(DOMXPathResultImpl*)result;
    if(r==NULL)
    {
      r=new (fMemoryManager) DOMXPathResultImpl(type, fMemoryManager);
      r_cleanup.reset (r);
    }
    else
        r->reset(type);

    XPathMatcher matcher(fParsedExpression, fMemoryManager);
    matcher.startDocumentFragment();

    if(fMoveToRoot)
    {
        contextNode=contextNode->getOwnerDocument();
        if(contextNode==NULL)
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

        QName qName(contextNode->getNodeName(), 0, fMemoryManager);
        SchemaElementDecl elemDecl(&qName);
        RefVectorOf<XMLAttr> attrList(0, true, fMemoryManager);
        matcher.startElement(elemDecl, 0, XMLUni::fgZeroLenString, attrList, 0);
        DOMNode* child=contextNode->getFirstChild();
        while(child)
        {
            if(child->getNodeType()==DOMNode::ELEMENT_NODE)
                testNode(&matcher, r, (DOMElement*)child);
            child=child->getNextSibling();
        }
        matcher.endElement(elemDecl, XMLUni::fgZeroLenString);
    }
    else
        testNode(&matcher, r, (DOMElement*)contextNode);

    r_cleanup.release ();
    return r;
}